

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O2

uint32_t __thiscall SQASTWritingVisitor::writeString(SQASTWritingVisitor *this,SQChar *s)

{
  iterator iVar1;
  mapped_type *pmVar2;
  uint uVar3;
  SQChar *local_28;
  
  local_28 = s;
  iVar1 = std::
          _Hashtable<const_char_*,_std::pair<const_char_*const,_unsigned_int>,_StdArenaAllocator<std::pair<const_char_*const,_unsigned_int>_>,_std::__detail::_Select1st,_SQASTWritingVisitor::eq_str,_SQASTWritingVisitor::str_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<const_char_*,_std::pair<const_char_*const,_unsigned_int>,_StdArenaAllocator<std::pair<const_char_*const,_unsigned_int>_>,_std::__detail::_Select1st,_SQASTWritingVisitor::eq_str,_SQASTWritingVisitor::str_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)&this->stringTable,&local_28);
  if (iVar1.super__Node_iterator_base<std::pair<const_char_*const,_unsigned_int>,_true>._M_cur ==
      (__node_type *)0x0) {
    uVar3 = this->stringIndexes->_size;
    ArenaVector<const_char_*>::push_back(this->stringIndexes,&local_28);
    pmVar2 = std::__detail::
             _Map_base<const_char_*,_std::pair<const_char_*const,_unsigned_int>,_StdArenaAllocator<std::pair<const_char_*const,_unsigned_int>_>,_std::__detail::_Select1st,_SQASTWritingVisitor::eq_str,_SQASTWritingVisitor::str_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<const_char_*,_std::pair<const_char_*const,_unsigned_int>,_StdArenaAllocator<std::pair<const_char_*const,_unsigned_int>_>,_std::__detail::_Select1st,_SQASTWritingVisitor::eq_str,_SQASTWritingVisitor::str_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->stringTable,&local_28);
    *pmVar2 = uVar3;
    OutputStream::writeVaruint(this->stream,(ulong)uVar3);
  }
  else {
    OutputStream::writeVaruint
              (this->stream,
               (ulong)*(uint *)((long)iVar1.
                                      super__Node_iterator_base<std::pair<const_char_*const,_unsigned_int>,_true>
                                      ._M_cur + 0x10));
    uVar3 = *(uint *)((long)iVar1.
                            super__Node_iterator_base<std::pair<const_char_*const,_unsigned_int>,_true>
                            ._M_cur + 0x10);
  }
  return uVar3;
}

Assistant:

uint32_t SQASTWritingVisitor::writeString(const SQChar *s) {
  auto it = stringTable.find(s);

  if (it != stringTable.end()) {
    stream->writeUInt32(it->second);
    return it->second;
  }

  unsigned idx = stringIndexes.size();
  stringIndexes.push_back(s);
  stringTable[s] = idx;

  stream->writeUInt32(idx);
  return idx;
}